

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDisjointSets.h
# Opt level: O0

void __thiscall HighsDisjointSets<false>::reset(HighsDisjointSets<false> *this,HighsInt numItems)

{
  iterator __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  vector<int,_std::allocator<int>_> *__new_size;
  
  __new_size = (vector<int,_std::allocator<int>_> *)in_RDI._M_current;
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffffe0,(size_type)in_RDI._M_current,(value_type_conflict2 *)0x6ddecd
            );
  std::vector<int,_std::allocator<int>_>::resize(unaff_retaddr,(size_type)__new_size);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_RDI._M_current);
  __first = std::vector<int,_std::allocator<int>_>::end(in_RDI._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             in_RDI,0);
  return;
}

Assistant:

void reset(HighsInt numItems) {
    sizes.assign(numItems, 1);
    sets.resize(numItems);
    std::iota(sets.begin(), sets.end(), 0);
  }